

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

Aig_Man_t * Saig_ManPerformAbstraction(Saig_Tsim_t *pTsi,int nFrames,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  int *piVar6;
  long lVar7;
  void *__s;
  Aig_Man_t *p;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  Aig_Obj_t *p1;
  uint uVar13;
  size_t sVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  
  if (pTsi->vNonXRegs->nSize < 1) {
    __assert_fail("Vec_IntSize(pTsi->vNonXRegs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x2f4,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
  }
  pAVar3 = pTsi->pAig;
  lVar7 = (long)nFrames;
  lVar19 = pAVar3->vObjs->nSize * lVar7;
  sVar14 = lVar19 * 8;
  __s = malloc(sVar14);
  pcVar8 = (char *)0x0;
  memset(__s,0,sVar14);
  p = Aig_ManStart((int)lVar19);
  pcVar4 = pAVar3->pName;
  if (pcVar4 != (char *)0x0) {
    sVar14 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p->pName = pcVar8;
  pcVar4 = pAVar3->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p->pSpec = pcVar8;
  if (0 < nFrames) {
    pAVar9 = p->pConst1;
    iVar18 = pAVar3->pConst1->Id;
    uVar12 = 0;
    do {
      *(Aig_Obj_t **)((long)__s + uVar12 * 8 + iVar18 * lVar7 * 8) = pAVar9;
      uVar12 = uVar12 + 1;
    } while ((uint)nFrames != uVar12);
  }
  if (0 < nFrames) {
    iVar18 = 0;
    do {
      if (pAVar3->nRegs < pAVar3->nObjs[2]) {
        lVar19 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar19) goto LAB_006ecadd;
          pvVar5 = pAVar3->vCis->pArray[lVar19];
          pAVar9 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar18) * 8)
               = pAVar9;
          lVar19 = lVar19 + 1;
        } while (lVar19 < (long)pAVar3->nObjs[2] - (long)pAVar3->nRegs);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != nFrames);
  }
  uVar13 = pAVar3->nObjs[2] - pAVar3->nRegs;
  pVVar11 = pAVar3->vCis;
  if ((int)uVar13 < pVVar11->nSize) {
    uVar12 = (ulong)uVar13;
    do {
      if ((int)uVar13 < 0) goto LAB_006ecadd;
      pvVar5 = pVVar11->pArray[uVar12];
      pAVar9 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__s + *(int *)((long)pvVar5 + 0x24) * lVar7 * 8) = pAVar9;
      uVar12 = uVar12 + 1;
      pVVar11 = pAVar3->vCis;
    } while ((int)uVar12 < pVVar11->nSize);
  }
  if (0 < nFrames) {
    uVar12 = 0;
    do {
      lVar7 = (long)pTsi->vNonXRegs->nSize;
      iVar18 = (int)uVar12;
      if (0 < lVar7) {
        piVar6 = pTsi->vNonXRegs->pArray;
        pVVar11 = pAVar3->vCis;
        iVar15 = pAVar3->nTruePis;
        lVar19 = 0;
        do {
          iVar1 = piVar6[lVar19];
          uVar13 = iVar15 + iVar1;
          if ((((int)uVar13 < 0) || (pVVar11->nSize <= (int)uVar13)) ||
             ((long)pTsi->vStates->nSize <= (long)uVar12)) goto LAB_006ecadd;
          uVar2 = *(uint *)((long)pTsi->vStates->pArray[uVar12] + (long)(iVar1 >> 4) * 4);
          uVar16 = uVar2 >> (((byte)(iVar1 * 2) & 0x1e) + 1 & 0x1f) & 1;
          bVar21 = (uVar2 >> (iVar1 * 2 & 0x1fU) & 1) != 0;
          if (1 < ((uint)bVar21 + uVar16 * 2) - 1) {
            __assert_fail("Value == SAIG_XVS0 || Value == SAIG_XVS1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                          ,0x312,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
          }
          if ((uint)bVar21 + uVar16 * 2 == 2) {
            pAVar9 = p->pConst1;
          }
          else {
            pAVar9 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
          }
          *(Aig_Obj_t **)
           ((long)__s +
           (long)(*(int *)((long)pVVar11->pArray[uVar13] + 0x24) * nFrames + iVar18) * 8) = pAVar9;
          lVar19 = lVar19 + 1;
        } while (lVar7 != lVar19);
      }
      pVVar11 = pAVar3->vObjs;
      if (0 < pVVar11->nSize) {
        lVar7 = 0;
        do {
          pvVar5 = pVVar11->pArray[lVar7];
          if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
            uVar10 = *(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar5 + 8) & 1) ^
                       *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar18) * 8
                                 ));
            }
            uVar10 = *(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar5 + 0x10) & 1) ^
                   *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar18) * 8));
            }
            pAVar9 = Aig_And(p,pAVar9,p1);
            *(Aig_Obj_t **)
             ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar18) * 8) = pAVar9;
          }
          lVar7 = lVar7 + 1;
          pVVar11 = pAVar3->vObjs;
        } while (lVar7 < pVVar11->nSize);
      }
      iVar15 = pAVar3->nRegs;
      lVar7 = (long)iVar15;
      if (0 < lVar7) {
        pVVar11 = pAVar3->vCos;
        iVar1 = pAVar3->nObjs[3];
        uVar10 = (ulong)(uint)(iVar1 - iVar15);
        iVar15 = -iVar15;
        do {
          if (((int)uVar10 < 0) || (pVVar11->nSize <= iVar1 + iVar15)) goto LAB_006ecadd;
          uVar13 = pAVar3->nObjs[2] + iVar15;
          if (((int)uVar13 < 0) || (pAVar3->vCis->nSize <= (int)uVar13)) goto LAB_006ecadd;
          uVar17 = *(ulong *)((long)pVVar11->pArray[uVar10] + 8);
          uVar20 = uVar17 & 0xfffffffffffffffe;
          if (uVar20 == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)((uint)uVar17 & 1) ^
                     *(ulong *)((long)__s + (long)(*(int *)(uVar20 + 0x24) * nFrames + iVar18) * 8);
          }
          if ((long)uVar12 < (long)(nFrames + -1)) {
            *(ulong *)((long)__s +
                      (long)(*(int *)((long)pAVar3->vCis->pArray[uVar13] + 0x24) * nFrames +
                            iVar18 + 1) * 8) = uVar17;
          }
          uVar10 = uVar10 + 1;
          iVar15 = iVar15 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)nFrames);
  }
  if (0 < nFrames) {
    iVar18 = 0;
    do {
      if (pAVar3->nRegs < pAVar3->nObjs[3]) {
        lVar7 = 0;
        do {
          if (pAVar3->vCos->nSize <= lVar7) goto LAB_006ecadd;
          pvVar5 = pAVar3->vCos->pArray[lVar7];
          uVar12 = *(ulong *)((long)pvVar5 + 8);
          uVar10 = uVar12 & 0xfffffffffffffffe;
          if (uVar10 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar12 & 1) ^
                     *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar18) * 8))
            ;
          }
          pAVar9 = Aig_ObjCreateCo(p,pAVar9);
          *(Aig_Obj_t **)((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar18) * 8)
               = pAVar9;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)pAVar3->nObjs[3] - (long)pAVar3->nRegs);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != nFrames);
  }
  iVar18 = pAVar3->nRegs;
  p->nRegs = iVar18;
  iVar15 = p->nObjs[3];
  p->nTruePis = p->nObjs[2] - iVar18;
  p->nTruePos = iVar15 - iVar18;
  uVar13 = pAVar3->nObjs[3] - pAVar3->nRegs;
  pVVar11 = pAVar3->vCos;
  if ((int)uVar13 < pVVar11->nSize) {
    uVar12 = (ulong)uVar13;
    do {
      if ((int)uVar13 < 0) {
LAB_006ecadd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pVVar11->pArray[uVar12];
      uVar10 = *(ulong *)((long)pvVar5 + 8);
      uVar17 = uVar10 & 0xfffffffffffffffe;
      if (uVar17 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar10 & 1) ^
                 *(ulong *)((long)__s + (long)(*(int *)(uVar17 + 0x24) * nFrames + nFrames + -1) * 8
                           ));
      }
      pAVar9 = Aig_ObjCreateCo(p,pAVar9);
      *(Aig_Obj_t **)
       ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + nFrames + -1) * 8) = pAVar9;
      uVar12 = uVar12 + 1;
      pVVar11 = pAVar3->vCos;
    } while ((int)uVar12 < pVVar11->nSize);
  }
  Aig_ManSeqCleanup(p);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManPerformAbstraction( Saig_Tsim_t * pTsi, int nFrames, int fVerbose )
{
    Aig_Man_t * pFrames, * pAig = pTsi->pAig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    unsigned * pState;
    int i, f, Reg, Value;

    assert( Vec_IntSize(pTsi->vNonXRegs) > 0 );

    // create mapping for the frames nodes
    pObjMap = ABC_ALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Saig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // create the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // replace abstracted registers by constants
        Vec_IntForEachEntry( pTsi->vNonXRegs, Reg, i )
        {
            pObj = Saig_ManLo( pAig, Reg );
            pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, f );
            Value = (Abc_InfoHasBit( pState, 2 * Reg + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * Reg );
            assert( Value == SAIG_XVS0 || Value == SAIG_XVS1 );
            pObjNew = (Value == SAIG_XVS1)? Aig_ManConst1(pFrames) : Aig_ManConst0(pFrames);
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i ) 
        {
            pObjNew = Aig_And( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Saig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Saig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Saig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    pFrames->nRegs = pAig->nRegs;
    pFrames->nTruePis = Aig_ManCiNum(pFrames) - Aig_ManRegNum(pFrames); 
    pFrames->nTruePos = Aig_ManCoNum(pFrames) - Aig_ManRegNum(pFrames); 
    Aig_ManForEachLiSeq( pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,nFrames-1) );
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, nFrames-1, pObjNew );
    }
//Aig_ManPrintStats( pFrames );
    Aig_ManSeqCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
//    Aig_ManCiCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
    ABC_FREE( pObjMap );
    return pFrames;
}